

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O3

int * Dau_DsdNormalizePerm(char *pStr,int *pMarks,int nMarks)

{
  ulong uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  long lVar13;
  
  auVar3 = _DAT_0093d220;
  if (0 < nMarks) {
    uVar10 = (ulong)(uint)nMarks;
    lVar13 = uVar10 - 1;
    auVar11._8_4_ = (int)lVar13;
    auVar11._0_8_ = lVar13;
    auVar11._12_4_ = (int)((ulong)lVar13 >> 0x20);
    uVar5 = 0;
    auVar11 = auVar11 ^ _DAT_0093d220;
    auVar12 = _DAT_0093d210;
    do {
      auVar14 = auVar12 ^ auVar3;
      if ((bool)(~(auVar14._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar14._0_4_ ||
                  auVar11._4_4_ < auVar14._4_4_) & 1)) {
        Dau_DsdNormalizePerm::pPerm[uVar5] = (int)uVar5;
      }
      if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
          auVar14._12_4_ <= auVar11._12_4_) {
        Dau_DsdNormalizePerm::pPerm[uVar5 + 1] = (int)uVar5 + 1;
      }
      uVar5 = uVar5 + 2;
      lVar13 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar13 + 2;
    } while ((nMarks + 1U & 0xfffffffe) != uVar5);
    if (0 < nMarks) {
      uVar8 = 1;
      uVar5 = 0;
      do {
        uVar1 = uVar5 + 1;
        if (uVar1 < uVar10) {
          uVar7 = uVar5 & 0xffffffff;
          uVar9 = uVar8;
          do {
            iVar4 = Dau_DsdNormalizeCompare
                              (pStr,pMarks,Dau_DsdNormalizePerm::pPerm[(int)uVar7],
                               Dau_DsdNormalizePerm::pPerm[uVar9]);
            uVar6 = uVar9 & 0xffffffff;
            if (iVar4 != 1) {
              uVar6 = uVar7;
            }
            uVar9 = uVar9 + 1;
            iVar4 = (int)uVar6;
            uVar7 = uVar6;
          } while (uVar10 != uVar9);
        }
        else {
          iVar4 = (int)uVar5;
        }
        iVar2 = Dau_DsdNormalizePerm::pPerm[uVar5];
        Dau_DsdNormalizePerm::pPerm[uVar5] = Dau_DsdNormalizePerm::pPerm[iVar4];
        Dau_DsdNormalizePerm::pPerm[iVar4] = iVar2;
        uVar8 = uVar8 + 1;
        uVar5 = uVar1;
      } while (uVar1 != uVar10);
    }
  }
  return Dau_DsdNormalizePerm::pPerm;
}

Assistant:

int * Dau_DsdNormalizePerm( char * pStr, int * pMarks, int nMarks )
{
    static int pPerm[DAU_MAX_VAR];
    int i, k;
    for ( i = 0; i < nMarks; i++ )
        pPerm[i] = i;
    for ( i = 0; i < nMarks; i++ )
    {
        int iBest = i;
        for ( k = i + 1; k < nMarks; k++ )
            if ( Dau_DsdNormalizeCompare( pStr, pMarks, pPerm[iBest], pPerm[k] ) == 1 )
                iBest = k;
        ABC_SWAP( int, pPerm[i], pPerm[iBest] );
    }
    return pPerm;
}